

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O3

Expr * __thiscall kratos::Var::duplicate(Var *this,shared_ptr<kratos::Const> *count)

{
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *pvVar1;
  element_type *this_00;
  int iVar2;
  undefined4 extraout_var;
  Expr *local_38;
  shared_ptr<kratos::VarDuplicated> expr;
  undefined1 local_11;
  
  expr.super___shared_ptr<kratos::VarDuplicated,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  std::__shared_ptr<kratos::VarDuplicated,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<kratos::VarDuplicated>,kratos::Var*,std::shared_ptr<kratos::Const>const&>
            ((__shared_ptr<kratos::VarDuplicated,(__gnu_cxx::_Lock_policy)2> *)&local_38,
             (allocator<kratos::VarDuplicated> *)&local_11,
             (Var **)&expr.super___shared_ptr<kratos::VarDuplicated,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,count);
  iVar2 = (*(this->super_IRNode)._vptr_IRNode[0xd])(this);
  this_00 = expr.super___shared_ptr<kratos::VarDuplicated,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  expr.super___shared_ptr<kratos::VarDuplicated,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38;
  if (expr.super___shared_ptr<kratos::VarDuplicated,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      pvVar1 = &((expr.super___shared_ptr<kratos::VarDuplicated,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                ->super_Expr).super_Var.super_IRNode.fn_name_ln;
      *(int *)&(pvVar1->
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               )._M_impl.super__Vector_impl_data._M_start =
           *(int *)&(pvVar1->
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + 1;
      UNLOCK();
    }
    else {
      pvVar1 = &((expr.super___shared_ptr<kratos::VarDuplicated,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                ->super_Expr).super_Var.super_IRNode.fn_name_ln;
      *(int *)&(pvVar1->
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               )._M_impl.super__Vector_impl_data._M_start =
           *(int *)&(pvVar1->
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + 1;
    }
  }
  std::
  _Hashtable<std::shared_ptr<kratos::Expr>,std::shared_ptr<kratos::Expr>,std::allocator<std::shared_ptr<kratos::Expr>>,std::__detail::_Identity,std::equal_to<std::shared_ptr<kratos::Expr>>,std::hash<std::shared_ptr<kratos::Expr>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::_M_emplace<std::shared_ptr<kratos::Expr>const&>
            ((_Hashtable<std::shared_ptr<kratos::Expr>,std::shared_ptr<kratos::Expr>,std::allocator<std::shared_ptr<kratos::Expr>>,std::__detail::_Identity,std::equal_to<std::shared_ptr<kratos::Expr>>,std::hash<std::shared_ptr<kratos::Expr>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)(CONCAT44(extraout_var,iVar2) + 400),
             &expr.super___shared_ptr<kratos::VarDuplicated,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  if (this_00 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
  }
  if (expr.super___shared_ptr<kratos::VarDuplicated,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               expr.super___shared_ptr<kratos::VarDuplicated,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return local_38;
}

Assistant:

Expr &Var::duplicate(const std::shared_ptr<Const> &count) const {
    auto expr = std::make_shared<VarDuplicated>(const_cast<Var *>(this), count);
    generator()->add_expr(expr);
    return *expr;
}